

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_zlib_inflate_and_verify
              (uchar *pin,size_t sin,uint16_t *zdebug_table,uchar *pout,size_t sout)

{
  int iVar1;
  size_t sout_local;
  uchar *pout_local;
  uint16_t *zdebug_table_local;
  size_t sin_local;
  uchar *pin_local;
  
  iVar1 = elf_zlib_inflate(pin,sin,zdebug_table,pout,sout);
  if (iVar1 == 0) {
    pin_local._4_4_ = 0;
  }
  else {
    iVar1 = elf_zlib_verify_checksum(pin + (sin - 4),pout,sout);
    if (iVar1 == 0) {
      pin_local._4_4_ = 0;
    }
    else {
      pin_local._4_4_ = 1;
    }
  }
  return pin_local._4_4_;
}

Assistant:

static int
elf_zlib_inflate_and_verify (const unsigned char *pin, size_t sin,
			     uint16_t *zdebug_table, unsigned char *pout,
			     size_t sout)
{
  if (!elf_zlib_inflate (pin, sin, zdebug_table, pout, sout))
    return 0;
  if (!elf_zlib_verify_checksum (pin + sin - 4, pout, sout))
    return 0;
  return 1;
}